

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * json_parse_file(char *filename)

{
  char *string;
  JSON_Value *output_value;
  char *file_contents;
  char *filename_local;
  
  string = read_file(filename);
  if (string == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)json_parse_string(string);
    (*parson_free)(string);
  }
  return (JSON_Value *)filename_local;
}

Assistant:

JSON_Value * json_parse_file(const char *filename) {
    char *file_contents = read_file(filename);
    JSON_Value *output_value = NULL;
    if (file_contents == NULL) {
        return NULL;
    }
    output_value = json_parse_string(file_contents);
    parson_free(file_contents);
    return output_value;
}